

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O3

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                  BottomLevelASDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  BLASTriangleDesc *pBVar2;
  BLASBoundingBoxDesc *pBVar3;
  Uint64 UVar4;
  Uint32 UVar5;
  undefined4 uVar6;
  Uint32 UVar7;
  RAYTRACING_BUILD_AS_FLAGS RVar8;
  undefined3 uVar9;
  int iVar10;
  size_t sVar11;
  IMemoryAllocator *pIVar12;
  char *pcVar13;
  undefined4 extraout_var_00;
  BottomLevelASDesc *Args_1;
  RefCountersImpl *this_00;
  RenderDeviceVkImpl *pRVar14;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::IBottomLevelASVk>::RefCountedObject<>
            ((RefCountedObject<Diligent::IBottomLevelASVk> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IBottomLevelASVk>).
  super_RefCountedObject<Diligent::IBottomLevelASVk>.super_IBottomLevelASVk.super_IBottomLevelAS.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00aefbd0;
  this->m_pDevice = pDevice;
  pBVar2 = ObjDesc->pTriangles;
  UVar5 = ObjDesc->TriangleCount;
  uVar6 = *(undefined4 *)&ObjDesc->field_0x14;
  pBVar3 = ObjDesc->pBoxes;
  UVar7 = ObjDesc->BoxCount;
  RVar8 = ObjDesc->Flags;
  uVar9 = *(undefined3 *)&ObjDesc->field_0x25;
  UVar4 = ObjDesc->CompactedSize;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).pTriangles = pBVar2;
  (this->m_Desc).TriangleCount = UVar5;
  *(undefined4 *)&(this->m_Desc).field_0x14 = uVar6;
  (this->m_Desc).pBoxes = pBVar3;
  (this->m_Desc).BoxCount = UVar7;
  (this->m_Desc).Flags = RVar8;
  *(undefined3 *)&(this->m_Desc).field_0x25 = uVar9;
  (this->m_Desc).CompactedSize = UVar4;
  (this->m_Desc).ImmediateContextMask = ObjDesc->ImmediateContextMask;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar10 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar10 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar10 = iVar10 + 1;
  }
  this->m_UniqueID = iVar10;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    pRVar14 = this->m_pDevice;
    if (pRVar14 == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (BottomLevelASDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      pRVar14 = this->m_pDevice;
    }
    this_00 = (pRVar14->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
              super_ObjectBase<Diligent::IRenderDeviceVk>.
              super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters;
    if (this_00 == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pRVar14->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                super_ObjectBase<Diligent::IRenderDeviceVk>.
                super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters;
    }
    RefCountersImpl::AddStrongRef(this_00);
  }
  pcVar13 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar13 == (char *)0x0) {
    pIVar12 = GetStringAllocator();
    iVar10 = (**pIVar12->_vptr_IMemoryAllocator)
                       (pIVar12,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar13 = (char *)CONCAT44(extraout_var_00,iVar10);
    snprintf(pcVar13,0x13,"0x%llX",this);
  }
  else {
    sVar11 = strlen(pcVar13);
    pIVar12 = GetStringAllocator();
    iVar10 = (**pIVar12->_vptr_IMemoryAllocator)
                       (pIVar12,sVar11 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar13 = (char *)CONCAT44(extraout_var,iVar10);
    memcpy(pcVar13,(ObjDesc->super_DeviceObjectAttribs).Name,sVar11 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar13;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }